

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

void Llb_ManPrintSpan(Llb_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  pVVar3 = p->vGroups;
  if (pVVar3->nSize < 1) {
    uVar5 = 0;
  }
  else {
    uVar8 = 0;
    uVar5 = 0;
    uVar6 = 0;
    do {
      pvVar2 = pVVar3->pArray[uVar8];
      lVar4 = (long)*(int *)(*(long *)((long)pvVar2 + 8) + 4);
      if (0 < lVar4) {
        lVar7 = 0;
        do {
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)((long)pvVar2 + 8) + 8) + lVar7 * 8) + 0x24)
          ;
          if (((long)iVar1 < 0) || (p->vVarBegs->nSize <= iVar1)) goto LAB_00924bfd;
          uVar6 = uVar6 + (uVar8 == (uint)p->vVarBegs->pArray[iVar1]);
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
      lVar4 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + 4);
      if (0 < lVar4) {
        lVar7 = 0;
        do {
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x10) + 8) + lVar7 * 8) +
                          0x24);
          if (((long)iVar1 < 0) || (p->vVarBegs->nSize <= iVar1)) goto LAB_00924bfd;
          uVar6 = uVar6 + (uVar8 == (uint)p->vVarBegs->pArray[iVar1]);
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
      if ((int)uVar5 <= (int)uVar6) {
        uVar5 = uVar6;
      }
      printf("%d ");
      lVar4 = (long)*(int *)(*(long *)((long)pvVar2 + 8) + 4);
      if (0 < lVar4) {
        lVar7 = 0;
        do {
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)((long)pvVar2 + 8) + 8) + lVar7 * 8) + 0x24)
          ;
          if (((long)iVar1 < 0) || (p->vVarEnds->nSize <= iVar1)) goto LAB_00924bfd;
          uVar6 = uVar6 - (uVar8 == (uint)p->vVarEnds->pArray[iVar1]);
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
      lVar4 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + 4);
      if (0 < lVar4) {
        lVar7 = 0;
        do {
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x10) + 8) + lVar7 * 8) +
                          0x24);
          if (((long)iVar1 < 0) || (p->vVarEnds->nSize <= iVar1)) {
LAB_00924bfd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar6 = uVar6 - (uVar8 == (uint)p->vVarEnds->pArray[iVar1]);
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
      uVar8 = uVar8 + 1;
      pVVar3 = p->vGroups;
    } while ((long)uVar8 < (long)pVVar3->nSize);
  }
  putchar(10);
  printf("Max = %d\n",(ulong)uVar5);
  return;
}

Assistant:

void Llb_ManPrintSpan( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k, Span = 0, SpanMax = 0;
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGroup, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) == i )
                Span++;
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) == i )
                Span++;

        SpanMax = Abc_MaxInt( SpanMax, Span );
printf( "%d ", Span );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) == i )
                Span--;
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) == i )
                Span--;
    }
printf( "\n" );
printf( "Max = %d\n", SpanMax );
}